

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_io.c
# Opt level: O2

int CVodeSetMaxOrd(void *cvode_mem,int maxord)

{
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    iVar1 = 0xa3;
  }
  else if (maxord < 1) {
    msgfmt = "maxord <= 0 illegal.";
    error_code = -0x16;
    iVar1 = 0xab;
  }
  else {
    iVar1 = *(int *)((long)cvode_mem + 0x834);
    if (*(int *)((long)cvode_mem + 0x830) < *(int *)((long)cvode_mem + 0x834)) {
      iVar1 = *(int *)((long)cvode_mem + 0x830);
    }
    if (*(int *)((long)cvode_mem + 0x838) <= iVar1) {
      iVar1 = *(int *)((long)cvode_mem + 0x838);
    }
    if (maxord <= iVar1) {
      *(int *)((long)cvode_mem + 0x598) = maxord;
      return 0;
    }
    msgfmt = "Illegal attempt to increase maximum method order.";
    error_code = -0x16;
    iVar1 = 0xb8;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,iVar1,"CVodeSetMaxOrd",
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_io.c"
                 ,msgfmt);
  return error_code;
}

Assistant:

int CVodeSetMaxOrd(void* cvode_mem, int maxord)
{
  CVodeMem cv_mem;
  int qmax_alloc;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  if (maxord <= 0)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_NEG_MAXORD);
    return (CV_ILL_INPUT);
  }

  /* Cannot increase maximum order beyond the value that
     was used when allocating memory */
  qmax_alloc = cv_mem->cv_qmax_alloc;
  qmax_alloc = SUNMIN(qmax_alloc, cv_mem->cv_qmax_allocQ);
  qmax_alloc = SUNMIN(qmax_alloc, cv_mem->cv_qmax_allocS);

  if (maxord > qmax_alloc)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_MAXORD);
    return (CV_ILL_INPUT);
  }

  cv_mem->cv_qmax = maxord;

  return (CV_SUCCESS);
}